

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int nonce_function_bip340
              (uchar *nonce32,uchar *msg,size_t msglen,uchar *key32,uchar *xonly_pk32,uchar *algo,
              size_t algolen,void *data)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  secp256k1_sha256 sha;
  uint local_b8 [8];
  secp256k1_sha256 local_98;
  
  if (algo == (uchar *)0x0) {
    return 0;
  }
  if (data == (void *)0x0) {
    lVar8 = 0;
    do {
      puVar1 = (uint *)(key32 + lVar8);
      uVar2 = puVar1[1];
      uVar3 = puVar1[2];
      uVar4 = puVar1[3];
      uVar5 = *(uint *)(nonce_function_bip340::ZERO_MASK + lVar8 + 4);
      uVar6 = *(uint *)(nonce_function_bip340::ZERO_MASK + lVar8 + 8);
      uVar7 = *(uint *)(nonce_function_bip340::ZERO_MASK + lVar8 + 0xc);
      *(uint *)((long)local_b8 + lVar8) =
           *puVar1 ^ *(uint *)(nonce_function_bip340::ZERO_MASK + lVar8);
      *(uint *)((long)local_b8 + lVar8 + 4) = uVar2 ^ uVar5;
      *(uint *)((long)local_b8 + lVar8 + 8) = uVar3 ^ uVar6;
      *(uint *)((long)local_b8 + lVar8 + 0xc) = uVar4 ^ uVar7;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x20);
  }
  else {
    local_98.s[0] = 0x24dd3219;
    local_98.s[1] = 0x4eba7e70;
    local_98.s[2] = 0xca0fabb9;
    local_98.s[3] = 0xfa3166d;
    local_98.s[4] = 0x3afbe4b1;
    local_98.s[5] = 0x4c44df97;
    local_98.s[6] = 0x4aac2739;
    local_98.s[7] = 0x249e850a;
    local_98.bytes = 0x40;
    secp256k1_sha256_write(&local_98,(uchar *)data,0x20);
    secp256k1_sha256_finalize(&local_98,(uchar *)local_b8);
    lVar8 = 0;
    do {
      puVar1 = (uint *)(key32 + lVar8);
      uVar2 = puVar1[1];
      uVar3 = puVar1[2];
      uVar4 = puVar1[3];
      *(uint *)((long)local_b8 + lVar8) = *puVar1 ^ *(uint *)((long)local_b8 + lVar8);
      *(uint *)((long)local_b8 + lVar8 + 4) = uVar2 ^ *(uint *)((long)local_b8 + lVar8 + 4);
      *(uint *)((long)local_b8 + lVar8 + 8) = uVar3 ^ *(uint *)((long)local_b8 + lVar8 + 8);
      *(uint *)((long)local_b8 + lVar8 + 0xc) = uVar4 ^ *(uint *)((long)local_b8 + lVar8 + 0xc);
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x20);
  }
  if (algolen == 0xd) {
    lVar8 = 0;
    do {
      if (algo[lVar8] != "BIP0340/nonce"[lVar8]) {
        algolen = 0xd;
        goto LAB_0010e85f;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0xd);
    local_98.s[0] = 0x46615b35;
    local_98.s[1] = 0xf4bfbff7;
    local_98.s[2] = 0x9f8dc671;
    local_98.s[3] = 0x83627ab3;
    local_98.s[4] = 0x60217180;
    local_98.s[5] = 0x57358661;
    local_98.s[6] = 0x21a29e54;
    local_98.s[7] = 0x68b07b4c;
    local_98.bytes = 0x40;
  }
  else {
LAB_0010e85f:
    secp256k1_sha256_initialize_tagged(&local_98,algo,algolen);
  }
  secp256k1_sha256_write(&local_98,(uchar *)local_b8,0x20);
  secp256k1_sha256_write(&local_98,xonly_pk32,0x20);
  secp256k1_sha256_write(&local_98,msg,msglen);
  secp256k1_sha256_finalize(&local_98,nonce32);
  return 1;
}

Assistant:

static int nonce_function_bip340(unsigned char *nonce32, const unsigned char *msg, size_t msglen, const unsigned char *key32, const unsigned char *xonly_pk32, const unsigned char *algo, size_t algolen, void *data) {
    secp256k1_sha256 sha;
    unsigned char masked_key[32];
    int i;

    if (algo == NULL) {
        return 0;
    }

    if (data != NULL) {
        secp256k1_nonce_function_bip340_sha256_tagged_aux(&sha);
        secp256k1_sha256_write(&sha, data, 32);
        secp256k1_sha256_finalize(&sha, masked_key);
        for (i = 0; i < 32; i++) {
            masked_key[i] ^= key32[i];
        }
    } else {
        /* Precomputed TaggedHash("BIP0340/aux", 0x0000...00); */
        static const unsigned char ZERO_MASK[32] = {
              84, 241, 105, 207, 201, 226, 229, 114,
             116, 128,  68,  31, 144, 186,  37, 196,
             136, 244,  97, 199,  11,  94, 165, 220,
             170, 247, 175, 105, 39,  10, 165,  20
        };
        for (i = 0; i < 32; i++) {
            masked_key[i] = key32[i] ^ ZERO_MASK[i];
        }
    }

    /* Tag the hash with algo which is important to avoid nonce reuse across
     * algorithms. If this nonce function is used in BIP-340 signing as defined
     * in the spec, an optimized tagging implementation is used. */
    if (algolen == sizeof(bip340_algo)
            && secp256k1_memcmp_var(algo, bip340_algo, algolen) == 0) {
        secp256k1_nonce_function_bip340_sha256_tagged(&sha);
    } else {
        secp256k1_sha256_initialize_tagged(&sha, algo, algolen);
    }

    /* Hash masked-key||pk||msg using the tagged hash as per the spec */
    secp256k1_sha256_write(&sha, masked_key, 32);
    secp256k1_sha256_write(&sha, xonly_pk32, 32);
    secp256k1_sha256_write(&sha, msg, msglen);
    secp256k1_sha256_finalize(&sha, nonce32);
    return 1;
}